

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  ImGuiStoragePair *pIVar5;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar6;
  ImGuiStoragePair *pIVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  pIVar7 = this->Data;
  if ((pIVar7 <= it) && (iVar3 = this->Size, it <= pIVar7 + iVar3)) {
    lVar10 = (long)it - (long)pIVar7;
    iVar4 = this->Capacity;
    if (iVar3 == iVar4) {
      if (iVar4 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar4 / 2 + iVar4;
      }
      iVar11 = iVar3 + 1;
      if (iVar3 + 1 < iVar8) {
        iVar11 = iVar8;
      }
      if (iVar4 < iVar11) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar7 = (ImGuiStoragePair *)
                 (*GImAllocatorAllocFunc)((long)iVar11 << 4,GImAllocatorUserData);
        if (this->Data != (ImGuiStoragePair *)0x0) {
          memcpy(pIVar7,this->Data,(long)this->Size << 4);
          pIVar5 = this->Data;
          if ((pIVar5 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
        }
        this->Data = pIVar7;
        this->Capacity = iVar11;
      }
    }
    lVar9 = (long)this->Size - (lVar10 >> 4);
    if (lVar9 != 0 && lVar10 >> 4 <= (long)this->Size) {
      memmove((void *)((long)this->Data + lVar10 + 0x10),(void *)((long)this->Data + lVar10),
              lVar9 * 0x10);
    }
    aVar6 = v->field_1;
    puVar2 = (undefined8 *)((long)this->Data + lVar10);
    *puVar2 = *(undefined8 *)v;
    *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)(puVar2 + 1) = aVar6;
    this->Size = this->Size + 1;
    return (ImGuiStoragePair *)(lVar10 + (long)this->Data);
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x500,
                "T *ImVector<ImGuiStorage::ImGuiStoragePair>::insert(const T *, const T &) [T = ImGuiStorage::ImGuiStoragePair]"
               );
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }